

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool ZeroKeyTest<Blob<128>>(pfHash hash,bool drawDiagram)

{
  bool bVar1;
  reference pvVar2;
  byte in_SIL;
  code *in_RDI;
  ulong uVar3;
  bool result;
  int i;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> hashes;
  uchar *nullblock;
  int keycount;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar4;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_ffffffffffffffa0;
  code *pcVar5;
  int local_40;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> local_30;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *local_18;
  int local_10;
  byte local_9;
  code *local_8;
  
  local_9 = in_SIL & 1;
  local_10 = 0x32000;
  local_8 = in_RDI;
  printf("Keyset \'Zeroes\' - %d keys\n",0x32000);
  uVar3 = (ulong)local_10;
  if ((long)uVar3 < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  local_18 = (vector<Blob<128>,_std::allocator<Blob<128>_>_> *)operator_new__(uVar3);
  memset(local_18,0,(long)local_10);
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)0x162bf5);
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::resize
            (in_stack_ffffffffffffffa0,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
            );
  for (local_40 = 0; local_40 < local_10; local_40 = local_40 + 1) {
    in_stack_ffffffffffffff90 = local_18;
    iVar4 = local_40;
    pcVar5 = local_8;
    pvVar2 = std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::operator[]
                       (&local_30,(long)local_40);
    (*pcVar5)(in_stack_ffffffffffffff90,iVar4,0,pvVar2);
  }
  bVar1 = TestHashList<Blob<128>>
                    ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)nullblock,
                     hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._7_1_,
                     hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._6_1_,
                     hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._5_1_,
                     hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_1_,
                     hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._3_1_);
  printf("\n");
  if (local_18 != (vector<Blob<128>,_std::allocator<Blob<128>_>_> *)0x0) {
    operator_delete__(local_18);
  }
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::~vector(in_stack_ffffffffffffff90);
  return bVar1;
}

Assistant:

bool ZeroKeyTest ( pfHash hash, bool drawDiagram )
{
  int keycount = 200*1024;

  printf("Keyset 'Zeroes' - %d keys\n",keycount);

  unsigned char * nullblock = new unsigned char[keycount];
  memset(nullblock,0,keycount);

  //----------

  std::vector<hashtype> hashes;

  hashes.resize(keycount);

  for(int i = 0; i < keycount; i++)
  {
    hash(nullblock,i,0,&hashes[i]);
  }

  bool result = true;

  result &= TestHashList(hashes,drawDiagram);

  printf("\n");

  delete [] nullblock;

  return result;
}